

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a.cpp
# Opt level: O3

void msd_A(cacheblock_t *cache,size_t N,size_t cache_depth,size_t true_depth)

{
  undefined8 *puVar1;
  uchar *puVar2;
  int iVar3;
  uchar *puVar4;
  void *__src;
  size_t sVar5;
  long lVar6;
  cacheblock_t *pcVar7;
  uint i;
  cacheblock_t *pcVar8;
  byte bVar9;
  byte bVar10;
  size_t __size;
  size_t bucketsize [256];
  size_t local_838 [257];
  
  if (N < 0x20) {
    if (1 < N) {
      pcVar7 = cache;
      do {
        puVar4 = pcVar7[1].ptr;
        pcVar7 = pcVar7 + 1;
        for (pcVar8 = pcVar7; cache < pcVar8; pcVar8 = pcVar8 + -1) {
          puVar2 = pcVar8[-1].ptr;
          bVar9 = puVar2[true_depth];
          bVar10 = puVar4[true_depth];
          if ((bVar9 != 0) && (lVar6 = true_depth + 1, bVar9 == bVar10)) {
            do {
              bVar9 = puVar2[lVar6];
              bVar10 = puVar4[lVar6];
              if (bVar9 == 0) break;
              lVar6 = lVar6 + 1;
            } while (bVar9 == bVar10);
          }
          if (bVar9 <= bVar10) break;
          pcVar8->ptr = puVar2;
        }
        iVar3 = (int)N;
        pcVar8->ptr = puVar4;
        N = (size_t)(iVar3 - 1);
      } while (2 < iVar3);
    }
  }
  else {
    if (3 < cache_depth) {
      fill_cache(cache,N,true_depth);
      cache_depth = 0;
    }
    memset(local_838,0,0x800);
    puVar4 = cache->bytes + cache_depth;
    sVar5 = N;
    do {
      local_838[*puVar4] = local_838[*puVar4] + 1;
      puVar4 = puVar4 + 0x10;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
    __size = N << 4;
    __src = malloc(__size);
    msd_A::bucketindex[0] = 0;
    lVar6 = 0;
    sVar5 = 0;
    do {
      sVar5 = sVar5 + local_838[lVar6];
      msd_A::bucketindex[lVar6 + 1] = sVar5;
      lVar6 = lVar6 + 1;
      pcVar7 = cache;
    } while (lVar6 != 0xff);
    do {
      sVar5 = msd_A::bucketindex[pcVar7->bytes[cache_depth]];
      msd_A::bucketindex[pcVar7->bytes[cache_depth]] = sVar5 + 1;
      puVar4 = pcVar7->ptr;
      puVar1 = (undefined8 *)((long)__src + sVar5 * 0x10);
      *puVar1 = *(undefined8 *)pcVar7;
      puVar1[1] = puVar4;
      N = N - 1;
      pcVar7 = pcVar7 + 1;
    } while (N != 0);
    memcpy(cache,__src,__size);
    free(__src);
    lVar6 = 1;
    do {
      sVar5 = local_838[lVar6];
      if (sVar5 != 0) {
        msd_A(cache + local_838[0],sVar5,cache_depth + 1,true_depth + 1);
        local_838[0] = local_838[0] + sVar5;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
  }
  return;
}

Assistant:

static void
msd_A(cacheblock_t* cache, size_t N, size_t cache_depth, size_t true_depth)
{
	if (N < 32) {
		inssort_cache(cache, N, true_depth);
		return;
	}
	if (cache_depth >= CACHED_BYTES) {
		fill_cache(cache, N, true_depth);
		cache_depth = 0;
	}
	size_t bucketsize[256] = {0};
	for (size_t i=0; i < N; ++i)
		++bucketsize[cache[i].bytes[cache_depth]];
	cacheblock_t* sorted = (cacheblock_t*)
		malloc(N*sizeof(cacheblock_t));
	static size_t bucketindex[256];
	bucketindex[0] = 0;
	for (unsigned i=1; i < 256; ++i)
		bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
	for (size_t i=0; i < N; ++i)
		memcpy(&sorted[bucketindex[cache[i].bytes[cache_depth]]++],
				cache+i, sizeof(cacheblock_t));
	memcpy(cache, sorted, N*sizeof(cacheblock_t));
	free(sorted);
	size_t bsum = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_A(cache+bsum, bucketsize[i],
			  cache_depth+1, true_depth+1);
		bsum += bucketsize[i];
	}
}